

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

c_int csc_cumsum(c_int *p,c_int *c,c_int n)

{
  long lVar1;
  c_int cVar2;
  long lVar3;
  long lVar4;
  
  if (c != (c_int *)0x0 && p != (c_int *)0x0) {
    lVar3 = 0;
    lVar4 = 0;
    if (0 < n) {
      lVar4 = n;
    }
    cVar2 = 0;
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      p[lVar3] = cVar2;
      lVar1 = c[lVar3];
      c[lVar3] = cVar2;
      cVar2 = lVar1 + cVar2;
    }
    p[n] = cVar2;
    return cVar2;
  }
  return -1;
}

Assistant:

c_int csc_cumsum(c_int *p, c_int *c, c_int n) {
  c_int i, nz = 0;

  if (!p || !c) return -1;  /* check inputs */

  for (i = 0; i < n; i++)
  {
    p[i] = nz;
    nz  += c[i];
    c[i] = p[i];
  }
  p[n] = nz;
  return nz; /* return sum (c [0..n-1]) */
}